

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O2

void Mvc_CoverArray2List(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t **ppMVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (pCover->pCubes != (Mvc_Cube_t **)0x0) {
    iVar3 = Mvc_CoverReadCubeNum(pCover);
    if (iVar3 != 0) {
      if (iVar3 == 1) {
        pMVar1 = *pCover->pCubes;
        pMVar1->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar1;
        (pCover->lCubes).pHead = pMVar1;
      }
      else {
        ppMVar2 = pCover->pCubes;
        (pCover->lCubes).pHead = *ppMVar2;
        pMVar1 = ppMVar2[(long)iVar3 + -1];
        pMVar1->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar1;
        uVar5 = 0;
        uVar4 = (ulong)(iVar3 - 1U);
        if ((int)(iVar3 - 1U) < 1) {
          uVar4 = uVar5;
        }
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          ppMVar2[uVar5]->pNext = ppMVar2[uVar5 + 1];
        }
      }
    }
    return;
  }
  __assert_fail("pCover->pCubes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mvc/mvcList.c"
                ,0x13b,"void Mvc_CoverArray2List(Mvc_Cover_t *)");
}

Assistant:

void Mvc_CoverArray2List( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nCubes, i;

    assert( pCover->pCubes );

    nCubes = Mvc_CoverReadCubeNum(pCover);
    if ( nCubes == 0 )
        return;
    if ( nCubes == 1 )
    {
        pCube    = pCover->pCubes[0];
        pCube->pNext = NULL;
        pCover->lCubes.pHead = pCover->lCubes.pTail = pCube;
        return;
    }
    // set up the first cube
    pCube = pCover->pCubes[0];
    pCover->lCubes.pHead = pCube;
    // set up the last cube
    pCube = pCover->pCubes[nCubes-1];
    pCube->pNext = NULL;
    pCover->lCubes.pTail = pCube;

    // link all cubes starting from the first one
    for ( i = 0; i < nCubes - 1; i++ )
        pCover->pCubes[i]->pNext = pCover->pCubes[i+1];
}